

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O1

HalfCycles __thiscall
Enterprise::ConcreteMachine<true,_false>::perform_machine_cycle
          (ConcreteMachine<true,_false> *this,PartialMachineCycle *cycle)

{
  EXDos *this_00;
  atomic_flag *paVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  HalfCycles HVar4;
  byte *pbVar5;
  Typer *__ptr;
  byte bVar6;
  uint8_t uVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ssize_t sVar12;
  WaitMode WVar13;
  ulong uVar14;
  ulong uVar15;
  size_t __n;
  char *pcVar16;
  void *__buf;
  void *__buf_00;
  WrappedInt<Cycles> duration;
  void *extraout_RDX;
  Cycles CVar17;
  uint __fd;
  WrappedInt<HalfCycles> WVar18;
  undefined1 local_60 [16];
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_50;
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_48;
  _Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false> local_38;
  
  if (cycle->address == (ushort *)0x0) {
    __fd = 0;
  }
  else {
    __fd = (uint)*cycle->address;
  }
  WVar18.length_ = 0;
  switch(cycle->operation) {
  case Write:
    if ((this->is_video_[__fd >> 0xe] == true) && ((this->nick_).is_flushed_ == false)) {
      (this->nick_).is_flushed_ = true;
      (this->nick_).did_flush_ = true;
      uVar14 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
           (long)uVar14 % 0x15aae00;
      if (0x15aadff < (long)uVar14) {
        Nick::run_for(&(this->nick_).object_,(Cycles)(uVar14 / 0x15aae00));
      }
    }
  case Read:
    if (this->is_video_[__fd >> 0xe] == true) {
LAB_0033e985:
      lVar10 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + 1;
LAB_0033e98f:
      CVar17 = Nick::get_time_until_z80_slot(&(this->nick_).object_,(Cycles)(lVar10 / 0xad5700));
      lVar10 = (lVar10 / 0xad5700) * 0x15aae00 +
               (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      lVar11 = SUB168(SEXT816(lVar10) * SEXT816(-0x351c2c02ebf155ef),8);
      WVar18.length_ =
           ((long)CVar17.super_WrappedInt<Cycles>.length_ * 0x15aae00 + lVar10 + 0xad56ff) /
           0x268fbab + ((lVar11 >> 0x17) - (lVar11 >> 0x3f));
    }
    else {
LAB_0033ea54:
      WVar18.length_ = 0;
    }
    break;
  case Input:
  case Output:
    if ((__fd & 0xf0) != 0x80) goto LAB_0033ea54;
    goto LAB_0033e985;
  case ReadOpcodeStart:
    if (this->is_video_[__fd >> 0xe] != true) {
      if (this->wait_mode_ != None) goto LAB_0033ea4b;
      goto LAB_0033ea54;
    }
    lVar10 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + 2;
    goto LAB_0033e98f;
  case ReadStart:
  case WriteStart:
    WVar18.length_ = 0;
    if ((this->is_video_[__fd >> 0xe] == false) &&
       (WVar18.length_ = 0, this->wait_mode_ == OnAllAccesses)) {
LAB_0033ea4b:
      WVar18.length_ = (this->dave_delay_).super_WrappedInt<HalfCycles>.length_;
    }
  }
  CVar17.super_WrappedInt<Cycles>.length_ =
       (WrappedInt<Cycles>)((cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar18.length_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)CVar17.super_WrappedInt<Cycles>.length_;
  local_50._M_head_impl = (Flywheel *)&this->nick_;
  uVar14 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ +
           (long)CVar17.super_WrappedInt<Cycles>.length_ * 0x268fbab;
  (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = uVar14;
  (this->nick_).is_flushed_ = false;
  lVar10 = (this->nick_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar11 = lVar10 + (long)CVar17.super_WrappedInt<Cycles>.length_ * -0x268fbab;
  (this->nick_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar11;
  if (lVar11 == 0 ||
      SBORROW8(lVar10,(long)CVar17.super_WrappedInt<Cycles>.length_ * 0x268fbab) != lVar11 < 0) {
    (this->nick_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar11 / 0xad5700;
    (this->nick_).is_flushed_ = true;
    (this->nick_).did_flush_ = true;
    (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = (long)uVar14 % 0x15aae00
    ;
    if (0x15aadff < (long)uVar14) {
      Nick::run_for(&(this->nick_).object_,(Cycles)(uVar14 / 0x15aae00));
    }
    JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::update_sequence_point
              ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)
               local_50._M_head_impl);
    bVar8 = (this->nick_).object_.interrupt_line_;
    if ((bVar8 == true) && (this->previous_nick_interrupt_line_ == false)) {
      HVar4.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)(this->nick_).time_overrun_.super_WrappedInt<HalfCycles>.length_;
      this->interrupt_state_ = this->interrupt_state_ | 0x20;
      update_interrupts(this,HVar4);
    }
    this->previous_nick_interrupt_line_ = bVar8;
  }
  local_48._M_head_impl = (Flywheel *)&this->dave_timer_;
  uVar14 = (this->dave_timer_).time_since_update_.super_WrappedInt<HalfCycles>.length_ +
           (long)CVar17.super_WrappedInt<Cycles>.length_;
  (this->dave_timer_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = uVar14;
  (this->dave_timer_).is_flushed_ = false;
  lVar10 = (this->dave_timer_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar11 = lVar10 - (long)CVar17.super_WrappedInt<Cycles>.length_;
  (this->dave_timer_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar11;
  if (lVar11 == 0 || lVar10 < (long)CVar17.super_WrappedInt<Cycles>.length_) {
    lVar10 = lVar11 + 7;
    if (-1 < lVar11) {
      lVar10 = lVar11;
    }
    (this->dave_timer_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar10 >> 3;
    (this->dave_timer_).is_flushed_ = true;
    (this->dave_timer_).did_flush_ = true;
    (this->dave_timer_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
         (long)uVar14 % 0x10;
    if (0xf < (long)uVar14) {
      Dave::TimedInterruptSource::run_for(&(this->dave_timer_).object_,(Cycles)(uVar14 >> 4));
    }
    JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::update_sequence_point
              ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)
               local_48._M_head_impl);
    if (lVar11 < 1) {
      bVar6 = Dave::TimedInterruptSource::get_new_interrupts(&(this->dave_timer_).object_);
      HVar4.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->dave_timer_).time_overrun_.super_WrappedInt<HalfCycles>.length_;
      this->interrupt_state_ = this->interrupt_state_ | bVar6;
      update_interrupts(this,HVar4);
    }
  }
  this_00 = &this->exdos_;
  WD::WD1770::run_for(&this_00->super_WD1770,CVar17);
  switch(cycle->operation) {
  case ReadOpcode:
  case Read:
    if (this->read_pointers_[__fd >> 0xe] != (uint8_t *)0x0) {
      uVar7 = this->read_pointers_[__fd >> 0xe][__fd];
      goto LAB_0033ec74;
    }
  case Interrupt:
switchD_0033ec53_caseD_5:
    *cycle->value = 0xff;
    break;
  case Write:
    if (this->write_pointers_[__fd >> 0xe] == (uint8_t *)0x0) {
      return (HalfCycles)WVar18.length_;
    }
    this->write_pointers_[__fd >> 0xe][__fd] = *cycle->value;
    return (HalfCycles)WVar18.length_;
  case Input:
    uVar9 = __fd & 0xff;
    if (0x36 < uVar9 - 0x80) {
      if (uVar9 - 0x10 < 8) {
        sVar12 = WD::WD1770::read(&this_00->super_WD1770,__fd,__buf,(ulong)(uVar9 - 0x10));
        uVar7 = (uint8_t)sVar12;
      }
      else {
        if (7 < uVar9 - 0x18) goto switchD_0033edae_caseD_90;
        uVar7 = EXDos::get_control_register(this_00);
      }
      goto LAB_0033ec74;
    }
    uVar14 = (long)&switchD_0033edae::switchdataD_004cbe84 +
             (long)(int)(&switchD_0033edae::switchdataD_004cbe84)[uVar9 - 0x80];
    switch(uVar9) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      LOCK();
      paVar1 = &(this->nick_).flush_concurrency_check_;
      _Var2 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var2 == false) {
        __buf_00 = __buf;
        if ((this->nick_).is_flushed_ == false) {
          (this->nick_).is_flushed_ = true;
          (this->nick_).did_flush_ = true;
          uVar14 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
          __buf_00 = (void *)((long)uVar14 % 0x15aae00);
          (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = (IntType)__buf_00;
          if (0x15aadff < (long)uVar14) {
            duration.length_ = uVar14 / 0x15aae00;
            Nick::run_for(&(this->nick_).object_,(Cycles)duration.length_);
            __fd = (uint)duration.length_;
            __buf_00 = extraout_RDX;
          }
        }
        LOCK();
        (this->nick_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        local_60._8_8_ = &(this->nick_).object_;
        local_60._0_8_ = local_50._M_head_impl;
        sVar12 = Nick::read((Nick *)local_60._8_8_,__fd,__buf_00,uVar14);
        *cycle->value = (uint8_t)sVar12;
        goto LAB_0033ee67;
      }
LAB_0033f2cb:
      pcVar16 = 
      "auto JustInTimeActor<Enterprise::Nick, HalfCycles, 40434603, 11360000>::operator->() [T = Enterprise::Nick, LocalTimeScale = HalfCycles, multiplier = 40434603, divider = 11360000]"
      ;
      goto LAB_0033f2f7;
    default:
switchD_0033edae_caseD_90:
      ConcreteMachine<true,false>::perform_machine_cycle();
      return (HalfCycles)WVar18.length_;
    case 0xb0:
      uVar7 = this->pages_[0];
      break;
    case 0xb1:
      uVar7 = this->pages_[1];
      break;
    case 0xb2:
      uVar7 = this->pages_[2];
      break;
    case 0xb3:
      uVar7 = this->pages_[3];
      break;
    case 0xb4:
      JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::operator->
                ((JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000> *)local_60);
      bVar8 = *(bool *)(local_60._8_8_ + 0x120);
      JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
                ((JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *)
                 &stack0xffffffffffffffc0);
      bVar6 = Dave::TimedInterruptSource::get_divider_state(local_38._M_head_impl);
      *cycle->value = bVar6 | bVar8 << 4 | this->interrupt_state_;
      std::
      unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                     *)&stack0xffffffffffffffc0);
LAB_0033ee67:
      std::
      unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Enterprise::Nick,_JustInTimeActor<Enterprise::Nick,_HalfCycles,_40434603,_11360000>::SequencePointAwareDeleter>
                     *)local_60);
      return (HalfCycles)WVar18.length_;
    case 0xb5:
      if ((ulong)this->active_key_line_ < 10) {
        uVar7 = (this->key_lines_)._M_elems[this->active_key_line_];
        break;
      }
    case 0xb6:
      goto switchD_0033ec53_caseD_5;
    }
LAB_0033ec74:
    *cycle->value = uVar7;
    break;
  case Output:
    uVar9 = __fd & 0xff;
    if (0x3f < uVar9 - 0x80) {
      if (uVar9 - 0x10 < 8) {
        WD::WD1770::write(&this_00->super_WD1770,__fd,(void *)(ulong)*cycle->value,
                          (ulong)(uVar9 - 0x10));
        return (HalfCycles)WVar18.length_;
      }
      if (uVar9 - 0x18 < 8) {
        EXDos::set_control_register(this_00,*cycle->value);
        return (HalfCycles)WVar18.length_;
      }
switchD_0033eccb_caseD_90:
      ConcreteMachine<true,false>::perform_machine_cycle();
      return (HalfCycles)WVar18.length_;
    }
    uVar14 = (long)&switchD_0033eccb::switchdataD_004cbd84 +
             (long)(int)(&switchD_0033eccb::switchdataD_004cbd84)[uVar9 - 0x80];
    switch(uVar9) {
    case 0x80:
    case 0x81:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
    case 0x89:
    case 0x8a:
    case 0x8b:
    case 0x8c:
    case 0x8d:
    case 0x8e:
    case 0x8f:
      LOCK();
      paVar1 = &(this->nick_).flush_concurrency_check_;
      _Var2 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var2 == false) {
        if ((this->nick_).is_flushed_ == false) {
          (this->nick_).is_flushed_ = true;
          (this->nick_).did_flush_ = true;
          uVar14 = (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
          (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
               (long)uVar14 % 0x15aae00;
          if (0x15aadff < (long)uVar14) {
            Nick::run_for(&(this->nick_).object_,(Cycles)(uVar14 / 0x15aae00));
          }
        }
        LOCK();
        (this->nick_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        local_60._8_8_ = &(this->nick_).object_;
        local_60._0_8_ = local_50._M_head_impl;
        Nick::write((Nick *)local_60._8_8_,__fd,(void *)(ulong)*cycle->value,uVar14);
        goto LAB_0033ee67;
      }
      goto LAB_0033f2cb;
    default:
      goto switchD_0033eccb_caseD_90;
    case 0xb0:
      ConcreteMachine<true,false>::page<0ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      return (HalfCycles)WVar18.length_;
    case 0xb1:
      ConcreteMachine<true,false>::page<1ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      return (HalfCycles)WVar18.length_;
    case 0xb2:
      ConcreteMachine<true,false>::page<2ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      return (HalfCycles)WVar18.length_;
    case 0xb3:
      ConcreteMachine<true,false>::page<3ul>((ConcreteMachine<true,false> *)this,*cycle->value);
      return (HalfCycles)WVar18.length_;
    case 0xb4:
      pbVar5 = cycle->value;
      this->interrupt_mask_ = *pbVar5 & 0x55;
      this->interrupt_state_ = this->interrupt_state_ & ~*pbVar5;
      update_interrupts(this,(HalfCycles)0x0);
      return (HalfCycles)WVar18.length_;
    case 0xb5:
      if (((this->active_key_line_ == '\t') && ((*cycle->value & 0xf) == 0)) &&
         ((this->should_skip_splash_screen_ != false ||
          ((this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
           super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
           super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
           super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl != (Typer *)0x0)))) {
        iVar3 = this->typer_delay_;
        if (this->should_skip_splash_screen_ == false) {
          if (iVar3 == 0) {
            bVar8 = Utility::Typer::type_next_character
                              ((this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
                               super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>
                               .super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl);
            if (!bVar8) {
              (this->key_lines_)._M_elems[8] = 0xff;
              (this->key_lines_)._M_elems[9] = 0xff;
              (this->key_lines_)._M_elems[0] = 0xff;
              (this->key_lines_)._M_elems[1] = 0xff;
              (this->key_lines_)._M_elems[2] = 0xff;
              (this->key_lines_)._M_elems[3] = 0xff;
              (this->key_lines_)._M_elems[4] = 0xff;
              (this->key_lines_)._M_elems[5] = 0xff;
              (this->key_lines_)._M_elems[6] = 0xff;
              (this->key_lines_)._M_elems[7] = 0xff;
              __ptr = (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
                      super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>
                      .super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
              (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
              super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
              super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
              super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
              if (__ptr != (Typer *)0x0) {
                std::default_delete<Utility::Typer>::operator()
                          ((default_delete<Utility::Typer> *)
                           &(this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_,__ptr);
              }
            }
            goto LAB_0033f26d;
          }
        }
        else {
          (this->key_lines_)._M_elems[8] = (iVar3 == 0) << 6 | (this->key_lines_)._M_elems[8] & 0xbf
          ;
          if (iVar3 == 0) {
            this->typer_delay_ = 0x3c;
            this->should_skip_splash_screen_ = false;
            goto LAB_0033f26d;
          }
        }
        this->typer_delay_ = iVar3 + -1;
      }
LAB_0033f26d:
      this->active_key_line_ = *cycle->value & 0xf;
      return (HalfCycles)WVar18.length_;
    case 0xb6:
      local_60._0_8_ = _stdout;
      fprintf((FILE *)_stdout,"[%s] ","Enterprise");
      bVar6 = *cycle->value;
      pcVar16 = "TODO: printer output: %02x";
      break;
    case 0xb7:
      local_60._0_8_ = _stdout;
      fprintf((FILE *)_stdout,"[%s] ","Enterprise");
      bVar6 = *cycle->value;
      pcVar16 = "TODO: serial output: %02x";
      break;
    case 0xbf:
      pbVar5 = cycle->value;
      bVar6 = *pbVar5 >> 2 & 3;
      WVar13 = OnAllAccesses;
      if (bVar6 != 0) {
        WVar13 = (WaitMode)(bVar6 == 1);
      }
      this->wait_mode_ = WVar13;
      (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = (ulong)(*pbVar5 & 2) + 2;
    case 0xa0:
    case 0xa1:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
      uVar14 = (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_;
      uVar15 = uVar14 + 0xf;
      if (-1 < (long)uVar14) {
        uVar15 = uVar14;
      }
      __n = uVar15 & 0xfffffffffffffff0;
      (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = (long)uVar14 % 0x10;
      Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::run_for
                (&this->speaker_,&this->audio_queue_,(Cycles)((long)uVar15 >> 4));
      Dave::Audio::write(&this->dave_audio_,__fd,(void *)(ulong)*cycle->value,__n);
      LOCK();
      paVar1 = &(this->dave_timer_).flush_concurrency_check_;
      _Var2 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var2 == false) {
        if ((this->dave_timer_).is_flushed_ == false) {
          (this->dave_timer_).is_flushed_ = true;
          (this->dave_timer_).did_flush_ = true;
          uVar14 = (this->dave_timer_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
          __n = (long)uVar14 % 0x10;
          (this->dave_timer_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = __n;
          if (0xf < (long)uVar14) {
            Dave::TimedInterruptSource::run_for(&(this->dave_timer_).object_,(Cycles)(uVar14 >> 4));
          }
        }
        LOCK();
        (this->dave_timer_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        local_60._8_8_ = &(this->dave_timer_).object_;
        local_60._0_8_ = local_48._M_head_impl;
        Dave::TimedInterruptSource::write
                  ((TimedInterruptSource *)local_60._8_8_,__fd,(void *)(ulong)*cycle->value,__n);
        std::
        unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
                       *)local_60);
        return (HalfCycles)WVar18.length_;
      }
      pcVar16 = 
      "auto JustInTimeActor<Enterprise::Dave::TimedInterruptSource, HalfCycles, 1, 8>::operator->() [T = Enterprise::Dave::TimedInterruptSource, LocalTimeScale = HalfCycles, multiplier = 1, divider = 8]"
      ;
LAB_0033f2f7:
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,pcVar16);
    }
    Log::Logger<(Log::Source)12>::LogLine::append((LogLine *)local_60,pcVar16,(ulong)bVar6);
    fputc(10,(FILE *)local_60._0_8_);
    return (HalfCycles)WVar18.length_;
  default:
    break;
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar18.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			using PartialMachineCycle = CPU::Z80::PartialMachineCycle;
			const uint16_t address = cycle.address ? *cycle.address : 0x0000;

			// Calculate an access penalty, if applicable.
			//
			// Rule applied here, which is slightly inferred:
			//
			//	Non-video reads and writes are delayed by exactly a cycle or not delayed at all,
			//	depending on the programmer's configuration of Dave.
			//
			//	Video reads and writes, and Nick port accesses, are delayed so that the last
			//	clock cycle of the machine cycle falls wholly inside the designated Z80 access
			//	window, per Nick.
			//
			// The switch statement below just attempts to implement that logic.
			//
			HalfCycles penalty;
			switch(cycle.operation) {
				default: break;

				// For non-video pauses, insert during the initial part of the bus cycle.
				case PartialMachineCycle::ReadStart:
				case PartialMachineCycle::WriteStart:
					if(!is_video_[address >> 14] && wait_mode_ == WaitMode::OnAllAccesses) {
						penalty = dave_delay_;
					}
				break;
				case PartialMachineCycle::ReadOpcodeStart: {
					if(is_video_[address >> 14]) {
						// Query Nick for the amount of delay that would occur with one cycle left
						// in this read opcode.
						const auto delay_time = nick_.time_since_flush(HalfCycles(2));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					} else if(wait_mode_ != WaitMode::None) {
						penalty = dave_delay_;
					}
				} break;

				// Video pauses: insert right at the end of the bus cycle.
				case PartialMachineCycle::Write:
					// Ensure all video that should have been collected prior to
					// this write has been.
					if(is_video_[address >> 14]) {
						nick_.flush();
					}
					[[fallthrough]];

				case PartialMachineCycle::Read:
					if(is_video_[address >> 14]) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				break;

				case PartialMachineCycle::Input:
				case PartialMachineCycle::Output: {
					if((address & 0xf0) == 0x80) {
						// Get delay, in Nick cycles, for a Z80 access that occurs in 0.5
						// cycles from now (i.e. with one cycle left to run).
						const auto delay_time = nick_.time_since_flush(HalfCycles(1));
						const auto delay = nick_.last_valid()->get_time_until_z80_slot(delay_time);
						penalty = nick_.back_map(delay, delay_time);
					}
				}
			}

			const HalfCycles full_length = cycle.length + penalty;
			time_since_audio_update_ += full_length;
			advance_nick(full_length);
			if(dave_timer_ += full_length) {
				set_interrupts(dave_timer_.last_valid()->get_new_interrupts(), dave_timer_.last_sequence_point_overrun());
			}

			// The WD/etc runs at a nominal 8Mhz.
			if constexpr (has_disk_controller) {
				exdos_.run_for(Cycles(full_length.as_integral()));
			}

			switch(cycle.operation) {
				default: break;

				case PartialMachineCycle::Interrupt:
					*cycle.value = 0xff;
				break;

				case PartialMachineCycle::Input:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled input from %02x", address & 0xff);
							*cycle.value = 0xff;
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.read(address);
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr (has_disk_controller) {
								*cycle.value = exdos_.get_control_register();
							} else {
								*cycle.value = 0xff;
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							*cycle.value = nick_->read();
						break;

						case 0xb0:	*cycle.value = pages_[0];	break;
						case 0xb1:	*cycle.value = pages_[1];	break;
						case 0xb2:	*cycle.value = pages_[2];	break;
						case 0xb3:	*cycle.value = pages_[3];	break;

						case 0xb4:
							*cycle.value =
								(nick_->get_interrupt_line() ? 0x10 : 0x00) |
								dave_timer_->get_divider_state() |
								interrupt_state_;
						break;
						case 0xb5:
							if(active_key_line_ < key_lines_.size()) {
								*cycle.value = key_lines_[active_key_line_];
							} else {
								*cycle.value = 0xff;
							}
						break;
						case 0xb6: {
							// TODO: selected keyboard row, 0 to 9, should return one bit of joystick
							// input. That being the case:
							//
							//	b0:		joystick input
							//	b1, b2:	unused (in theory read from control port, but not used by any hardware)
							//	b3:		0 = printer ready; 1 = not ready
							//	b4:		serial, data in
							//	b5:		serial, status in
							//	b6:		tape input volume level, 0 = high, 1 = low
							//	b7:		tape data input
							*cycle.value = 0xff;
						} break;
					}
				break;

				case PartialMachineCycle::Output:
					switch(address & 0xff) {
						default:
							logger.error().append("Unhandled output: %02x to %02x", *cycle.value, address & 0xff);
						break;

						case 0x10:	case 0x11:	case 0x12:	case 0x13:
						case 0x14:	case 0x15:	case 0x16:	case 0x17:
							if constexpr(has_disk_controller) {
								exdos_.write(address, *cycle.value);
							}
						break;
						case 0x18:	case 0x19:	case 0x1a:	case 0x1b:
						case 0x1c:	case 0x1d:	case 0x1e:	case 0x1f:
							if constexpr(has_disk_controller) {
								exdos_.set_control_register(*cycle.value);
							}
						break;

						case 0x80:	case 0x81:	case 0x82:	case 0x83:
						case 0x84:	case 0x85:	case 0x86:	case 0x87:
						case 0x88:	case 0x89:	case 0x8a:	case 0x8b:
						case 0x8c:	case 0x8d:	case 0x8e:	case 0x8f:
							nick_->write(address, *cycle.value);
						break;

						case 0xb0:	page<0>(*cycle.value);	break;
						case 0xb1:	page<1>(*cycle.value);	break;
						case 0xb2:	page<2>(*cycle.value);	break;
						case 0xb3:	page<3>(*cycle.value);	break;

						case 0xbf:
							switch((*cycle.value >> 2)&3) {
								default:	wait_mode_ = WaitMode::None;			break;
								case 0:		wait_mode_ = WaitMode::OnAllAccesses;	break;
								case 1:		wait_mode_ = WaitMode::OnM1;			break;
							}

							// Dave delays (i.e. those affecting memory areas not associated with Nick)
							// are one cycle in 8Mhz mode, two cycles in 12Mhz mode.
							dave_delay_ = HalfCycles(2 + ((*cycle.value)&2));

							[[fallthrough]];

						case 0xa0:	case 0xa1:	case 0xa2:	case 0xa3:
						case 0xa4:	case 0xa5:	case 0xa6:	case 0xa7:
						case 0xa8:	case 0xa9:	case 0xaa:	case 0xab:
						case 0xac:	case 0xad:	case 0xae:	case 0xaf:
							update_audio();
							dave_audio_.write(address, *cycle.value);
							dave_timer_->write(address, *cycle.value);
						break;

						case 0xb4:
							interrupt_mask_ = *cycle.value & 0x55;
							interrupt_state_ &= ~*cycle.value;
							update_interrupts();
						break;
						case 0xb5:
							// Logic here: the ROM scans the keyboard by checking ascending
							// lines. It also seems to provide a line of 0 when using port B5
							// for non-keyboard uses.
							//
							// So: use the rollover from line 9 back to line 0 as a trigger to
							// spot that a scan of the keyboard just finished. Which makes it
							// time to enqueue the next keypress.
							//
							// Re: should_skip_splash_screen_ and typer_delay_, assume that a
							// single keypress is necessary to get past the Enterprise splash
							// screen, then a pause in keypressing while BASIC or whatever
							// starts up, then presses can resume.
							if(active_key_line_ == 9 && !(*cycle.value & 0xf) && (should_skip_splash_screen_ || typer_)) {
								if(should_skip_splash_screen_) {
									set_key_state(uint16_t(Key::Space), typer_delay_);
									if(typer_delay_) {
										--typer_delay_;
									} else {
										typer_delay_ = 60;
										should_skip_splash_screen_ = false;
									}
								} else {
									if(!typer_delay_) {
										if(!typer_->type_next_character()) {
											clear_all_keys();
											typer_ = nullptr;
										}
									} else {
										--typer_delay_;
									}
								}
							}

							active_key_line_ = *cycle.value & 0xf;
							// TODO:
							//
							//	b4:	strobe output for printer
							//	b5:	tape sound control (?)
							//	b6:	tape motor control 1, 1 = on
							//	b7: tape motor control 2, 1 = on
						break;
						case 0xb6:
							// Just 8 bits of printer data.
							logger.info().append("TODO: printer output: %02x", *cycle.value);
						break;
						case 0xb7:
							// b0 = serial data out
							// b1 = serial status out
							logger.info().append("TODO: serial output: %02x", *cycle.value);
						break;
					}
				break;

				case PartialMachineCycle::Read:
				case PartialMachineCycle::ReadOpcode:
					if(read_pointers_[address >> 14]) {
						*cycle.value = read_pointers_[address >> 14][address];
					} else {
						*cycle.value = 0xff;
					}
				break;

				case PartialMachineCycle::Write:
					if(write_pointers_[address >> 14]) {
						write_pointers_[address >> 14][address] = *cycle.value;
					}
				break;
			}

			return penalty;
		}